

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t icu_63::GreekUpper::toUpper
                  (uint32_t options,UChar *dest,int32_t destCapacity,UChar *src,int32_t srcLength,
                  Edits *edits,UErrorCode *errorCode)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  UBool UVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int32_t result;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint destIndex;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  ulong local_58;
  UChar *s;
  
  local_58 = 0;
  bVar1 = 0;
  destIndex = 0;
  bVar17 = false;
LAB_002b8e8e:
  do {
    iVar10 = (int)local_58;
    if (srcLength <= iVar10) {
      return destIndex;
    }
    uVar9 = iVar10 + 1;
    uVar11 = (uint)(ushort)src[iVar10];
    uVar13 = uVar9;
    if ((((uVar11 & 0xfc00) == 0xd800) && (uVar9 != srcLength)) &&
       (((ushort)src[(int)uVar9] & 0xfc00) == 0xdc00)) {
      uVar11 = (uint)(ushort)src[iVar10] * 0x400 + (uint)(ushort)src[(int)uVar9] + 0xfca02400;
      uVar13 = iVar10 + 2;
    }
    uVar8 = (ulong)uVar13;
    uVar5 = ucase_getTypeOrIgnorable_63(uVar11);
    bVar15 = uVar5 != 0;
    bVar3 = uVar5 != 0;
    if ((uVar5 & 4) != 0) {
      bVar15 = (bool)(bVar1 & 1);
      bVar3 = bVar17;
    }
    uVar6 = getLetterData(uVar11);
    if (uVar6 == 0) {
      result = ucase_toFullUpper_63(uVar11,(UCaseContextIterator *)0x0,(void *)0x0,&s,4);
      destIndex = anon_unknown_9::appendResult
                            (dest,destIndex,destCapacity,result,s,uVar13 - iVar10,options,edits);
      local_58 = uVar8;
      bVar1 = bVar15;
    }
    else {
      uVar11 = uVar6 & 0x3ff;
      if ((((uVar6 >> 0xc & 1) != 0) && ((bVar1 & 2) != 0)) &&
         ((uVar11 == 0x3a5 || (uVar11 == 0x399)))) {
        uVar6 = uVar6 | 0x8000;
      }
      uVar5 = uVar6 >> 0xd & 1;
      uVar14 = (ulong)(int)uVar13;
      if ((int)uVar13 <= srcLength) {
        uVar8 = (ulong)(uint)srcLength;
      }
      while ((local_58 = uVar8, (long)uVar14 < (long)srcLength &&
             (uVar7 = getDiacriticData((uint)(ushort)src[uVar14]), local_58 = uVar14, uVar7 != 0)))
      {
        uVar6 = uVar6 | uVar7;
        uVar5 = uVar5 + ((uVar7 >> 0xd & 1) != 0);
        uVar14 = uVar14 + 1;
      }
      bVar1 = bVar15 + 2;
      if ((uVar6 & 0xd000) != 0x5000) {
        bVar1 = bVar15;
      }
      iVar12 = (int)local_58;
      if ((((uVar11 != 0x397) || ((uVar6 >> 0xe & 1) == 0)) || (uVar5 != 0)) ||
         ((bVar17 || (UVar4 = isFollowedByCasedLetter(src,iVar12,srcLength), UVar4 != '\0')))) {
        bVar17 = true;
        if ((short)uVar6 < 0) {
          if (uVar11 == 0x3a5) {
            bVar15 = false;
            uVar11 = 0x3ab;
            uVar6 = 0;
          }
          else {
            if (uVar11 == 0x399) {
              uVar11 = 0x3aa;
              uVar6 = 0;
            }
            bVar15 = false;
          }
        }
        else {
          bVar15 = false;
        }
      }
      else {
        bVar17 = iVar12 == iVar10;
        bVar15 = !bVar17;
        uVar11 = 0x397;
        if (bVar17) {
          uVar11 = 0x389;
        }
      }
      if ((options >> 0xe & 1) != 0 || edits != (Edits *)0x0) {
        bVar2 = 0 < (int)uVar5 || uVar11 != (ushort)src[iVar10];
        if ((uVar6 & 0x18000) != 0) {
          bVar16 = true;
          if ((int)uVar9 < iVar12) {
            bVar16 = src[(int)uVar9] != L'̈';
          }
          bVar2 = (bool)(bVar2 | bVar16);
          uVar9 = iVar10 + 2;
        }
        if (!bVar17) {
          bVar17 = true;
          if ((int)uVar9 < iVar12) {
            bVar17 = src[(int)uVar9] != L'́';
          }
          bVar2 = (bool)(bVar2 | bVar17);
          uVar9 = uVar9 + 1;
        }
        iVar12 = iVar12 - iVar10;
        iVar10 = (uVar9 - iVar10) + uVar5;
        if ((bool)(iVar12 != iVar10 | bVar2)) {
          if (edits != (Edits *)0x0) {
            Edits::addReplace(edits,iVar12,iVar10);
          }
        }
        else {
          if (edits != (Edits *)0x0) {
            Edits::addUnchanged(edits,iVar12);
          }
          bVar17 = bVar3;
          if ((options >> 0xe & 1) != 0) goto LAB_002b8e8e;
        }
      }
      if ((int)destIndex < destCapacity) {
        dest[(int)destIndex] = (UChar)uVar11;
LAB_002b91b2:
        uVar8 = (ulong)(destIndex + 1);
      }
      else {
        uVar8 = 0xffffffff;
        if (destIndex != 0x7fffffff) goto LAB_002b91b2;
      }
      uVar13 = 0xffffffff;
      iVar10 = (int)uVar8;
      if ((iVar10 < 0) || ((uVar6 & 0x18000) == 0)) {
LAB_002b91dd:
        uVar9 = (uint)uVar8;
        destIndex = uVar9;
        if (bVar15 && -1 < (int)uVar9) {
          if ((int)uVar9 < destCapacity) {
            dest[uVar8] = L'́';
          }
          else {
            destIndex = uVar13;
            if (uVar9 == 0x7fffffff) goto LAB_002b9208;
          }
          destIndex = uVar9 + 1;
        }
      }
      else {
        if (iVar10 < destCapacity) {
          dest[uVar8] = L'̈';
LAB_002b91db:
          uVar8 = (ulong)(iVar10 + 1);
          goto LAB_002b91dd;
        }
        destIndex = uVar13;
        if (iVar10 != 0x7fffffff) goto LAB_002b91db;
      }
LAB_002b9208:
      for (; (-1 < (int)destIndex && (0 < (int)uVar5)); uVar5 = uVar5 - 1) {
        if ((int)destIndex < destCapacity) {
          dest[destIndex] = L'Ι';
LAB_002b9227:
          uVar9 = destIndex + 1;
        }
        else {
          uVar9 = uVar13;
          if (destIndex != 0x7fffffff) goto LAB_002b9227;
        }
        destIndex = uVar9;
      }
    }
    bVar17 = bVar3;
    if ((int)destIndex < 0) {
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
  } while( true );
}

Assistant:

int32_t toUpper(uint32_t options,
                UChar *dest, int32_t destCapacity,
                const UChar *src, int32_t srcLength,
                Edits *edits,
                UErrorCode &errorCode) {
    int32_t destIndex=0;
    uint32_t state = 0;
    for (int32_t i = 0; i < srcLength;) {
        int32_t nextIndex = i;
        UChar32 c;
        U16_NEXT(src, nextIndex, srcLength, c);
        uint32_t nextState = 0;
        int32_t type = ucase_getTypeOrIgnorable(c);
        if ((type & UCASE_IGNORABLE) != 0) {
            // c is case-ignorable
            nextState |= (state & AFTER_CASED);
        } else if (type != UCASE_NONE) {
            // c is cased
            nextState |= AFTER_CASED;
        }
        uint32_t data = getLetterData(c);
        if (data > 0) {
            uint32_t upper = data & UPPER_MASK;
            // Add a dialytika to this iota or ypsilon vowel
            // if we removed a tonos from the previous vowel,
            // and that previous vowel did not also have (or gain) a dialytika.
            // Adding one only to the final vowel in a longer sequence
            // (which does not occur in normal writing) would require lookahead.
            // Set the same flag as for preserving an existing dialytika.
            if ((data & HAS_VOWEL) != 0 && (state & AFTER_VOWEL_WITH_ACCENT) != 0 &&
                    (upper == 0x399 || upper == 0x3A5)) {
                data |= HAS_DIALYTIKA;
            }
            int32_t numYpogegrammeni = 0;  // Map each one to a trailing, spacing, capital iota.
            if ((data & HAS_YPOGEGRAMMENI) != 0) {
                numYpogegrammeni = 1;
            }
            // Skip combining diacritics after this Greek letter.
            while (nextIndex < srcLength) {
                uint32_t diacriticData = getDiacriticData(src[nextIndex]);
                if (diacriticData != 0) {
                    data |= diacriticData;
                    if ((diacriticData & HAS_YPOGEGRAMMENI) != 0) {
                        ++numYpogegrammeni;
                    }
                    ++nextIndex;
                } else {
                    break;  // not a Greek diacritic
                }
            }
            if ((data & HAS_VOWEL_AND_ACCENT_AND_DIALYTIKA) == HAS_VOWEL_AND_ACCENT) {
                nextState |= AFTER_VOWEL_WITH_ACCENT;
            }
            // Map according to Greek rules.
            UBool addTonos = FALSE;
            if (upper == 0x397 &&
                    (data & HAS_ACCENT) != 0 &&
                    numYpogegrammeni == 0 &&
                    (state & AFTER_CASED) == 0 &&
                    !isFollowedByCasedLetter(src, nextIndex, srcLength)) {
                // Keep disjunctive "or" with (only) a tonos.
                // We use the same "word boundary" conditions as for the Final_Sigma test.
                if (i == nextIndex) {
                    upper = 0x389;  // Preserve the precomposed form.
                } else {
                    addTonos = TRUE;
                }
            } else if ((data & HAS_DIALYTIKA) != 0) {
                // Preserve a vowel with dialytika in precomposed form if it exists.
                if (upper == 0x399) {
                    upper = 0x3AA;
                    data &= ~HAS_EITHER_DIALYTIKA;
                } else if (upper == 0x3A5) {
                    upper = 0x3AB;
                    data &= ~HAS_EITHER_DIALYTIKA;
                }
            }

            UBool change;
            if (edits == nullptr && (options & U_OMIT_UNCHANGED_TEXT) == 0) {
                change = TRUE;  // common, simple usage
            } else {
                // Find out first whether we are changing the text.
                change = src[i] != upper || numYpogegrammeni > 0;
                int32_t i2 = i + 1;
                if ((data & HAS_EITHER_DIALYTIKA) != 0) {
                    change |= i2 >= nextIndex || src[i2] != 0x308;
                    ++i2;
                }
                if (addTonos) {
                    change |= i2 >= nextIndex || src[i2] != 0x301;
                    ++i2;
                }
                int32_t oldLength = nextIndex - i;
                int32_t newLength = (i2 - i) + numYpogegrammeni;
                change |= oldLength != newLength;
                if (change) {
                    if (edits != NULL) {
                        edits->addReplace(oldLength, newLength);
                    }
                } else {
                    if (edits != NULL) {
                        edits->addUnchanged(oldLength);
                    }
                    // Write unchanged text?
                    change = (options & U_OMIT_UNCHANGED_TEXT) == 0;
                }
            }

            if (change) {
                destIndex=appendUChar(dest, destIndex, destCapacity, (UChar)upper);
                if (destIndex >= 0 && (data & HAS_EITHER_DIALYTIKA) != 0) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x308);  // restore or add a dialytika
                }
                if (destIndex >= 0 && addTonos) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x301);
                }
                while (destIndex >= 0 && numYpogegrammeni > 0) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x399);
                    --numYpogegrammeni;
                }
                if(destIndex<0) {
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
            }
        } else {
            const UChar *s;
            c=ucase_toFullUpper(c, NULL, NULL, &s, UCASE_LOC_GREEK);
            destIndex = appendResult(dest, destIndex, destCapacity, c, s,
                                     nextIndex - i, options, edits);
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
        }
        i = nextIndex;
        state = nextState;
    }

    return destIndex;
}